

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_style_pop_font(nk_context *ctx)

{
  int iVar1;
  uint uVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x39a9,"int nk_style_pop_font(struct nk_context *)");
  }
  iVar1 = (ctx->stacks).fonts.head;
  if (0 < iVar1) {
    uVar2 = iVar1 - 1;
    (ctx->stacks).fonts.head = uVar2;
    *(ctx->stacks).fonts.elements[uVar2].address = (ctx->stacks).fonts.elements[uVar2].old_value;
    return 1;
  }
  __assert_fail("font_stack->head > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x39ad,"int nk_style_pop_font(struct nk_context *)");
}

Assistant:

NK_API int
nk_style_pop_font(struct nk_context *ctx)
{
    struct nk_config_stack_user_font *font_stack;
    struct nk_config_stack_user_font_element *element;

    NK_ASSERT(ctx);
    if (!ctx) return 0;

    font_stack = &ctx->stacks.fonts;
    NK_ASSERT(font_stack->head > 0);
    if (font_stack->head < 1)
        return 0;

    element = &font_stack->elements[--font_stack->head];
    *element->address = element->old_value;
    return 1;
}